

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filter.cpp
# Opt level: O1

void __thiscall Filter::update(Filter *this,vector<float,_std::allocator<float>_> *newData)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  pointer pfVar4;
  pointer pfVar5;
  int *piVar6;
  long lVar7;
  long *plVar8;
  int iVar9;
  ulong uVar10;
  float *pfVar11;
  long lVar12;
  
  iVar1 = this->measSize;
  if (0 < (long)iVar1) {
    pfVar4 = (newData->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pfVar5 = (newData->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    uVar2 = *(uint *)&this->meas;
    iVar3 = *(int *)&this->field_0x5c4;
    piVar6 = *(int **)&this->field_0x5f8;
    lVar7 = *(long *)&this->field_0x5c8;
    plVar8 = *(long **)&this->field_0x600;
    uVar10 = 0;
    lVar12 = lVar7;
    do {
      if ((long)pfVar5 - (long)pfVar4 >> 2 == uVar10) {
        return;
      }
      if (((uVar2 >> 0xe & 1) == 0) && (*piVar6 != 1)) {
        if (piVar6[1] == 1) {
          pfVar11 = (float *)(*plVar8 * uVar10 + lVar7);
        }
        else {
          iVar9 = (int)((long)((ulong)(uint)((int)uVar10 >> 0x1f) << 0x20 | uVar10 & 0xffffffff) /
                       (long)iVar3);
          pfVar11 = (float *)((long)iVar9 * *plVar8 + (long)(iVar9 * iVar3) * -4 + lVar12);
        }
      }
      else {
        pfVar11 = (float *)(lVar7 + uVar10 * 4);
      }
      *pfVar11 = pfVar4[uVar10];
      uVar10 = uVar10 + 1;
      lVar12 = lVar12 + 4;
    } while ((long)iVar1 != uVar10);
  }
  return;
}

Assistant:

void Filter::update(const vector<float> newData) {
    for (int i = 0; i < measSize; i++) {
        if (newData.size() == i)
            return;
        meas.at<float>(i) = newData[i];
    }
}